

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O3

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::set_texcoord
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,VertexHandle _vh,
          Vec2f *_texcoord)

{
  float fVar1;
  float fVar2;
  BasePropHandleT<OpenMesh::VectorT<double,_2>_> _h;
  PropertyT<OpenMesh::VectorT<double,_2>_> *this_00;
  reference pvVar3;
  
  _h.super_BaseHandle.idx_ =
       (BaseHandle)
       (this->mesh_->super_Mesh).
       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
       .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
       vertex_texcoords2D_.super_BasePropHandleT<OpenMesh::VectorT<double,_2>_>.super_BaseHandle.
       idx_;
  if (_h.super_BaseHandle.idx_ != -1) {
    fVar1 = (_texcoord->super_VectorDataT<float,_2>).values_[0];
    fVar2 = (_texcoord->super_VectorDataT<float,_2>).values_[1];
    this_00 = PropertyContainer::property<OpenMesh::VectorT<double,2>>
                        ((PropertyContainer *)
                         &(this->mesh_->super_Mesh).
                          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                          .
                          super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                          .field_0x8,_h);
    pvVar3 = PropertyT<OpenMesh::VectorT<double,_2>_>::operator[]
                       (this_00,(int)_vh.super_BaseHandle.idx_);
    (pvVar3->super_VectorDataT<double,_2>).values_[0] = (double)fVar1;
    (pvVar3->super_VectorDataT<double,_2>).values_[1] = (double)fVar2;
  }
  return;
}

Assistant:

virtual void set_texcoord(VertexHandle _vh, const Vec2f& _texcoord)
  {
    if (mesh_.has_vertex_texcoords2D())
      mesh_.set_texcoord2D(_vh, vector_cast<TexCoord2D>(_texcoord));
  }